

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,Cord *value)

{
  uint8_t *puVar1;
  bool bVar2;
  int size;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (size = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
    bVar2 = true;
  }
  else {
    size = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar2 = -1 < size;
  }
  if (bVar2) {
    bVar2 = io::CodedInputStream::ReadCord(input,value,size);
    return bVar2;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadBytes(io::CodedInputStream* input,
                                      absl::Cord* value) {
  int length;
  return input->ReadVarintSizeAsInt(&length) && input->ReadCord(value, length);
}